

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

base_learner * audit_regressor_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  io_buf *this;
  base_learner *l;
  single_learner *base;
  learner<audit_regressor_data,_example> *plVar5;
  vw_exception *pvVar6;
  allocator local_2a2;
  allocator local_2a1;
  string out_file;
  string local_280 [32];
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  option_group_definition new_options;
  free_ptr<audit_regressor_data> dat;
  undefined1 local_198 [96];
  bool local_138;
  
  out_file._M_dataplus._M_p = (pointer)&out_file.field_2;
  out_file._M_string_length = 0;
  out_file.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_240,"Audit Regressor",(allocator *)&dat);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::string((string *)&local_260,"audit_regressor",&local_2a1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&dat,&local_260,&out_file);
  local_138 = true;
  std::__cxx11::string::string
            (local_280,
             "stores feature names and their regressor values. Same dataset must be used for both regressor training and this mode."
             ,&local_2a2);
  std::__cxx11::string::_M_assign((string *)(local_198 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&new_options,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&dat);
  std::__cxx11::string::~string(local_280);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&dat);
  std::__cxx11::string::~string((string *)&local_260);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&dat,"audit_regressor",(allocator *)local_280);
  iVar3 = (*options->_vptr_options_i[1])(options,&dat);
  std::__cxx11::string::~string((string *)&dat);
  if ((char)iVar3 == '\0') {
    plVar5 = (learner<audit_regressor_data,_example> *)0x0;
  }
  else {
    if (out_file._M_string_length == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&dat);
      std::operator<<((ostream *)local_198,"audit_regressor argument (output filename) is missing.")
      ;
      pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
                 ,0x106,&local_200);
      __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (1 < all->numpasses) {
      std::__cxx11::stringstream::stringstream((stringstream *)&dat);
      std::operator<<((ostream *)local_198,"audit_regressor can\'t be used with --passes > 1.");
      pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
                 ,0x109,&local_220);
      __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    all->audit = true;
    scoped_calloc_or_throw<audit_regressor_data>();
    (dat._M_t.super___uniq_ptr_impl<audit_regressor_data,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_audit_regressor_data_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_audit_regressor_data_*,_false>._M_head_impl)->all = all;
    pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)operator_new(0x18);
    (pvVar4->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pvVar4->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar4->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (dat._M_t.super___uniq_ptr_impl<audit_regressor_data,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_audit_regressor_data_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_audit_regressor_data_*,_false>._M_head_impl)->ns_pre = pvVar4;
    this = (io_buf *)operator_new(0xa8);
    io_buf::io_buf(this);
    (dat._M_t.super___uniq_ptr_impl<audit_regressor_data,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_audit_regressor_data_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_audit_regressor_data_*,_false>._M_head_impl)->out_file = this;
    (**this->_vptr_io_buf)(this,out_file._M_dataplus._M_p,(ulong)all->stdin_off,2);
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar5 = LEARNER::init_learner<audit_regressor_data,example,LEARNER::learner<char,example>>
                       (&dat,base,audit_regressor,audit_regressor,1);
    uVar1 = *(undefined8 *)(plVar5 + 0x18);
    uVar2 = *(undefined8 *)(plVar5 + 0x20);
    *(undefined8 *)(plVar5 + 0xa0) = uVar1;
    *(undefined8 *)(plVar5 + 0xa8) = uVar2;
    *(code **)(plVar5 + 0xb0) = end_examples;
    *(undefined8 *)(plVar5 + 0x58) = uVar1;
    *(code **)(plVar5 + 0x68) = finish_example;
    *(undefined8 *)(plVar5 + 0xb8) = uVar1;
    *(undefined8 *)(plVar5 + 0xc0) = uVar2;
    *(code **)(plVar5 + 200) = finish;
    *(undefined8 *)plVar5 = uVar1;
    *(undefined8 *)(plVar5 + 8) = uVar2;
    *(code **)(plVar5 + 0x10) = init_driver;
    std::unique_ptr<audit_regressor_data,_void_(*)(void_*)>::~unique_ptr(&dat);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&out_file);
  return (base_learner *)plVar5;
}

Assistant:

LEARNER::base_learner* audit_regressor_setup(options_i& options, vw& all)
{
  string out_file;

  option_group_definition new_options("Audit Regressor");
  new_options.add(make_option("audit_regressor", out_file)
                      .keep()
                      .help("stores feature names and their regressor values. Same dataset must be used for both "
                            "regressor training and this mode."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("audit_regressor"))
    return nullptr;

  if (out_file.empty())
    THROW("audit_regressor argument (output filename) is missing.");

  if (all.numpasses > 1)
    THROW("audit_regressor can't be used with --passes > 1.");

  all.audit = true;

  auto dat = scoped_calloc_or_throw<audit_regressor_data>();
  dat->all = &all;
  dat->ns_pre = new vector<string>();  // explicitly invoking vector's constructor
  dat->out_file = new io_buf();
  dat->out_file->open_file(out_file.c_str(), all.stdin_off, io_buf::WRITE);

  LEARNER::learner<audit_regressor_data, example>& ret =
      LEARNER::init_learner(dat, as_singleline(setup_base(options, all)), audit_regressor, audit_regressor, 1);
  ret.set_end_examples(end_examples);
  ret.set_finish_example(finish_example);
  ret.set_finish(finish);
  ret.set_init_driver(init_driver);

  return LEARNER::make_base<audit_regressor_data>(ret);
}